

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcControllerType::IfcControllerType(IfcControllerType *this)

{
  IfcControllerType *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1d0,"IfcControllerType");
  IfcDistributionControlElementType::IfcDistributionControlElementType
            (&this->super_IfcDistributionControlElementType,&PTR_construction_vtable_24__00f94868);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcControllerType,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcControllerType,_1UL> *)
             &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
              field_0x1a0,&PTR_construction_vtable_24__00f949f0);
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject = 0xf94710;
  *(undefined8 *)&this->field_0x1d0 = 0xf94850;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x88 = 0xf94738;
  (this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
  super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0xf94760;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 = 0xf94788;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.super_IfcTypeProduct.field_0x148 = 0xf947b0;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.field_0x180 = 0xf947d8;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.
    super_IfcElementType.field_0x190 = 0xf94800;
  *(undefined8 *)
   &(this->super_IfcDistributionControlElementType).super_IfcDistributionElementType.field_0x1a0 =
       0xf94828;
  std::__cxx11::string::string
            ((string *)&(this->super_IfcDistributionControlElementType).field_0x1b0);
  return;
}

Assistant:

IfcControllerType() : Object("IfcControllerType") {}